

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *function;
  sysbvm_bitflags_t applicationFlags;
  sysbvm_tuple_t sVar1;
  size_t local_170;
  size_t i;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t applicationArgumentCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_53f9e59d gcFrame;
  sysbvm_astFunctionApplicationNode_t **applicationNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x18);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  applicationArgumentCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  callFrameStack.gcRoots.applicationArguments[0xf] =
       sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_evaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&i,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i);
  function = gcFrameRecord.roots;
  sVar1 = callFrameStack.gcRoots.applicationArguments[0xf];
  applicationFlags = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0x38));
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
             (sysbvm_tuple_t)function,sVar1,applicationFlags);
  for (local_170 = 0; local_170 < callFrameStack.gcRoots.applicationArguments[0xf];
      local_170 = local_170 + 1) {
    sVar1 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),local_170);
    sVar1 = sysbvm_interpreter_evaluateASTWithEnvironment(context,sVar1,arguments[1]);
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar1);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i);
  sVar1 = sysbvm_functionCallFrameStack_finish
                    (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*applicationNode)->super.sourcePosition);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    gcFrame.function = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*applicationNode)->functionExpression, *environment);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.function, applicationArgumentCount, sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags));

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}